

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O3

void __thiscall QStyleOptionComboBox::QStyleOptionComboBox(QStyleOptionComboBox *this,int version)

{
  QStyleOption::QStyleOption((QStyleOption *)this,version,0xf0004);
  (this->super_QStyleOptionComplex).subControls =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)0xffffffff;
  (this->super_QStyleOptionComplex).activeSubControls =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)0x0;
  this->editable = false;
  (this->popupRect).x1 = 0;
  (this->popupRect).y1 = 0;
  (this->popupRect).x2 = -1;
  (this->popupRect).y2 = -1;
  this->frame = true;
  (this->currentText).d.d = (Data *)0x0;
  (this->currentText).d.ptr = (char16_t *)0x0;
  (this->currentText).d.size = 0;
  QIcon::QIcon(&this->currentIcon);
  (this->iconSize).wd = -1;
  (this->iconSize).ht = -1;
  (this->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = 0x81;
  return;
}

Assistant:

QStyleOptionComboBox::QStyleOptionComboBox(int version)
    : QStyleOptionComplex(version, SO_ComboBox), editable(false), frame(true)
{
}